

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O0

Error __thiscall
llvm::DWARFDebugLine::Prologue::parse
          (Prologue *this,DWARFDataExtractor *DebugLineData,uint64_t *OffsetPtr,DWARFContext *Ctx,
          DWARFUnit *U)

{
  uint64_t *this_00;
  uint8_t uVar1;
  uint8_t uVar2;
  bool bVar3;
  uint16_t uVar4;
  uint32_t Size;
  char *pcVar5;
  uint64_t uVar6;
  uint64_t in_R9;
  error_code EC;
  error_code EC_00;
  error_code EC_01;
  error_code EC_02;
  Error local_d8;
  error_code local_d0;
  uint local_bc;
  Error local_b8;
  error_code local_b0;
  Error local_a0 [3];
  undefined1 local_88 [8];
  Error e;
  uint8_t OpLen;
  FormParams *pFStack_78;
  uint32_t I;
  uint64_t EndPrologueOffset;
  error_code local_68;
  error_code local_58;
  _func_int **local_48;
  uint64_t PrologueOffset;
  DWARFUnit *U_local;
  DWARFContext *Ctx_local;
  uint64_t *OffsetPtr_local;
  DWARFDataExtractor *DebugLineData_local;
  Prologue *this_local;
  
  local_48 = (Ctx->super_DIContext)._vptr_DIContext;
  PrologueOffset = in_R9;
  U_local = U;
  Ctx_local = Ctx;
  OffsetPtr_local = OffsetPtr;
  DebugLineData_local = DebugLineData;
  this_local = this;
  clear((Prologue *)DebugLineData);
  pcVar5 = (char *)DWARFDataExtractor::getRelocatedValue
                             ((DWARFDataExtractor *)OffsetPtr_local,4,(uint64_t *)Ctx_local,
                              (uint64_t *)0x0,(Error *)0x0);
  (DebugLineData->super_DataExtractor).Data.Data = pcVar5;
  if ((DebugLineData->super_DataExtractor).Data.Data == (char *)0xffffffff) {
    *(undefined1 *)((long)&(DebugLineData->super_DataExtractor).Data.Length + 3) = 1;
    pcVar5 = (char *)DataExtractor::getU64
                               ((DataExtractor *)OffsetPtr_local,(uint64_t *)Ctx_local,(Error *)0x0)
    ;
    (DebugLineData->super_DataExtractor).Data.Data = pcVar5;
  }
  else if ((char *)0xffffffef < (DebugLineData->super_DataExtractor).Data.Data) {
    std::error_code::error_code<llvm::errc,void>(&local_58,invalid_argument);
    EC._M_cat._0_4_ = local_58._M_value;
    EC._0_8_ = this;
    EC._M_cat._4_4_ = 0;
    createStringError<unsigned_long,unsigned_long>
              (EC,(char *)local_58._M_cat,
               (unsigned_long *)
               "parsing line table prologue at offset 0x%8.8lx unsupported reserved unit length found of value 0x%8.8lx"
               ,(unsigned_long *)&local_48);
    return (Error)(ErrorInfoBase *)this;
  }
  uVar4 = DataExtractor::getU16((DataExtractor *)OffsetPtr_local,(uint64_t *)Ctx_local,(Error *)0x0)
  ;
  *(uint16_t *)&(DebugLineData->super_DataExtractor).Data.Length = uVar4;
  uVar4 = getVersion((Prologue *)DebugLineData);
  if (uVar4 < 2) {
    std::error_code::error_code<llvm::errc,void>(&local_68,not_supported);
    EndPrologueOffset._6_2_ = getVersion((Prologue *)DebugLineData);
    EC_00._M_cat._0_4_ = local_68._M_value;
    EC_00._0_8_ = this;
    EC_00._M_cat._4_4_ = 0;
    createStringError<unsigned_long,unsigned_short>
              (EC_00,(char *)local_68._M_cat,
               (unsigned_long *)
               "parsing line table prologue at offset 0x%8.8lx found unsupported version 0x%2.2x",
               (unsigned_short *)&local_48);
    return (Error)(ErrorInfoBase *)this;
  }
  uVar4 = getVersion((Prologue *)DebugLineData);
  if (uVar4 < 5) goto LAB_02014de2;
  uVar1 = DataExtractor::getU8((DataExtractor *)OffsetPtr_local,(uint64_t *)Ctx_local,(Error *)0x0);
  *(uint8_t *)((long)&(DebugLineData->super_DataExtractor).Data.Length + 2) = uVar1;
  uVar1 = DataExtractor::getAddressSize((DataExtractor *)OffsetPtr_local);
  if (uVar1 == '\0') {
LAB_02014d8e:
    bVar3 = true;
  }
  else {
    uVar1 = DataExtractor::getAddressSize((DataExtractor *)OffsetPtr_local);
    uVar2 = getAddressSize((Prologue *)DebugLineData);
    bVar3 = false;
    if (uVar1 == uVar2) goto LAB_02014d8e;
  }
  if (!bVar3) {
    __assert_fail("(DebugLineData.getAddressSize() == 0 || DebugLineData.getAddressSize() == getAddressSize()) && \"Line table header and data extractor disagree\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFDebugLine.cpp"
                  ,0x162,
                  "Error llvm::DWARFDebugLine::Prologue::parse(const DWARFDataExtractor &, uint64_t *, const DWARFContext &, const DWARFUnit *)"
                 );
  }
  uVar1 = DataExtractor::getU8((DataExtractor *)OffsetPtr_local,(uint64_t *)Ctx_local,(Error *)0x0);
  *(uint8_t *)&DebugLineData->Obj = uVar1;
LAB_02014de2:
  this_00 = OffsetPtr_local;
  Size = sizeofPrologueLength((Prologue *)DebugLineData);
  uVar6 = DWARFDataExtractor::getRelocatedValue
                    ((DWARFDataExtractor *)this_00,Size,(uint64_t *)Ctx_local,(uint64_t *)0x0,
                     (Error *)0x0);
  (DebugLineData->super_DataExtractor).IsLittleEndian = (char)uVar6;
  (DebugLineData->super_DataExtractor).AddressSize = (char)(uVar6 >> 8);
  *(int6 *)&(DebugLineData->super_DataExtractor).field_0x12 = (int6)(uVar6 >> 0x10);
  pFStack_78 = (FormParams *)
               (*(long *)&(DebugLineData->super_DataExtractor).IsLittleEndian +
               (long)(Ctx_local->super_DIContext)._vptr_DIContext);
  uVar1 = DataExtractor::getU8((DataExtractor *)OffsetPtr_local,(uint64_t *)Ctx_local,(Error *)0x0);
  *(uint8_t *)((long)&DebugLineData->Obj + 1) = uVar1;
  uVar4 = getVersion((Prologue *)DebugLineData);
  if (3 < uVar4) {
    uVar1 = DataExtractor::getU8
                      ((DataExtractor *)OffsetPtr_local,(uint64_t *)Ctx_local,(Error *)0x0);
    *(uint8_t *)((long)&DebugLineData->Obj + 2) = uVar1;
  }
  uVar1 = DataExtractor::getU8((DataExtractor *)OffsetPtr_local,(uint64_t *)Ctx_local,(Error *)0x0);
  *(uint8_t *)((long)&DebugLineData->Obj + 3) = uVar1;
  uVar1 = DataExtractor::getU8((DataExtractor *)OffsetPtr_local,(uint64_t *)Ctx_local,(Error *)0x0);
  *(uint8_t *)((long)&DebugLineData->Obj + 4) = uVar1;
  uVar1 = DataExtractor::getU8((DataExtractor *)OffsetPtr_local,(uint64_t *)Ctx_local,(Error *)0x0);
  *(uint8_t *)((long)&DebugLineData->Obj + 5) = uVar1;
  uVar1 = DataExtractor::getU8((DataExtractor *)OffsetPtr_local,(uint64_t *)Ctx_local,(Error *)0x0);
  *(uint8_t *)((long)&DebugLineData->Obj + 6) = uVar1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(DebugLineData + 1),
             (long)(int)(*(byte *)((long)&DebugLineData->Obj + 6) - 1));
  for (e.Payload._4_4_ = 1; e.Payload._4_4_ < *(byte *)((long)&DebugLineData->Obj + 6);
      e.Payload._4_4_ = e.Payload._4_4_ + 1) {
    e.Payload._3_1_ =
         DataExtractor::getU8((DataExtractor *)OffsetPtr_local,(uint64_t *)Ctx_local,(Error *)0x0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(DebugLineData + 1),
               (value_type_conflict *)((long)&e.Payload + 3));
  }
  uVar4 = getVersion((Prologue *)DebugLineData);
  if (uVar4 < 5) {
    parseV2DirFileTables
              ((DWARFDataExtractor *)OffsetPtr_local,(uint64_t *)Ctx_local,(uint64_t)pFStack_78,
               (ContentTypeTracker *)((long)&DebugLineData->Obj + 7),
               (vector<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_> *)
               &DebugLineData[1].Obj,
               (vector<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
                *)&DebugLineData[2].super_DataExtractor.Data.Length);
  }
  else {
    parseV5DirFileTables
              ((DWARFDataExtractor *)local_88,OffsetPtr_local,(uint64_t)Ctx_local,pFStack_78,
               (DWARFContext *)&(DebugLineData->super_DataExtractor).Data.Length,U_local,
               (ContentTypeTracker *)PrologueOffset,
               (vector<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_> *)
               ((long)&DebugLineData->Obj + 7),
               (vector<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
                *)&DebugLineData[1].Obj);
    bVar3 = Error::operator_cast_to_bool((Error *)local_88);
    if (bVar3) {
      std::error_code::error_code<llvm::errc,void>(&local_b0,invalid_argument);
      EC_01._M_cat._0_4_ = local_b0._M_value;
      EC_01._0_8_ = local_a0;
      EC_01._M_cat._4_4_ = 0;
      createStringError<unsigned_long,unsigned_long>
                (EC_01,(char *)local_b0._M_cat,
                 (unsigned_long *)
                 "parsing line table prologue at 0x%8.8lx found an invalid directory or file table description at 0x%8.8lx"
                 ,(unsigned_long *)&local_48);
      Error::Error(&local_b8,(Error *)local_88);
      joinErrors((llvm *)this,local_a0,&local_b8);
      Error::~Error(&local_b8);
      Error::~Error(local_a0);
    }
    local_bc = (uint)bVar3;
    Error::~Error((Error *)local_88);
    if (local_bc != 0) {
      return (Error)(ErrorInfoBase *)this;
    }
  }
  if ((FormParams *)(Ctx_local->super_DIContext)._vptr_DIContext == pFStack_78) {
    Error::success();
    Error::Error((Error *)this,&local_d8);
    ErrorSuccess::~ErrorSuccess((ErrorSuccess *)&local_d8);
  }
  else {
    std::error_code::error_code<llvm::errc,void>(&local_d0,invalid_argument);
    EC_02._M_cat._0_4_ = local_d0._M_value;
    EC_02._0_8_ = this;
    EC_02._M_cat._4_4_ = 0;
    createStringError<unsigned_long,unsigned_long,unsigned_long>
              (EC_02,(char *)local_d0._M_cat,
               (unsigned_long *)
               "parsing line table prologue at 0x%8.8lx should have ended at 0x%8.8lx but it ended at 0x%8.8lx"
               ,(unsigned_long *)&local_48,(unsigned_long *)&stack0xffffffffffffff88);
  }
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error DWARFDebugLine::Prologue::parse(const DWARFDataExtractor &DebugLineData,
                                      uint64_t *OffsetPtr,
                                      const DWARFContext &Ctx,
                                      const DWARFUnit *U) {
  const uint64_t PrologueOffset = *OffsetPtr;

  clear();
  TotalLength = DebugLineData.getRelocatedValue(4, OffsetPtr);
  if (TotalLength == dwarf::DW_LENGTH_DWARF64) {
    FormParams.Format = dwarf::DWARF64;
    TotalLength = DebugLineData.getU64(OffsetPtr);
  } else if (TotalLength >= dwarf::DW_LENGTH_lo_reserved) {
    return createStringError(errc::invalid_argument,
        "parsing line table prologue at offset 0x%8.8" PRIx64
        " unsupported reserved unit length found of value 0x%8.8" PRIx64,
        PrologueOffset, TotalLength);
  }
  FormParams.Version = DebugLineData.getU16(OffsetPtr);
  if (getVersion() < 2)
    return createStringError(errc::not_supported,
                       "parsing line table prologue at offset 0x%8.8" PRIx64
                       " found unsupported version 0x%2.2" PRIx16,
                       PrologueOffset, getVersion());

  if (getVersion() >= 5) {
    FormParams.AddrSize = DebugLineData.getU8(OffsetPtr);
    assert((DebugLineData.getAddressSize() == 0 ||
            DebugLineData.getAddressSize() == getAddressSize()) &&
           "Line table header and data extractor disagree");
    SegSelectorSize = DebugLineData.getU8(OffsetPtr);
  }

  PrologueLength =
      DebugLineData.getRelocatedValue(sizeofPrologueLength(), OffsetPtr);
  const uint64_t EndPrologueOffset = PrologueLength + *OffsetPtr;
  MinInstLength = DebugLineData.getU8(OffsetPtr);
  if (getVersion() >= 4)
    MaxOpsPerInst = DebugLineData.getU8(OffsetPtr);
  DefaultIsStmt = DebugLineData.getU8(OffsetPtr);
  LineBase = DebugLineData.getU8(OffsetPtr);
  LineRange = DebugLineData.getU8(OffsetPtr);
  OpcodeBase = DebugLineData.getU8(OffsetPtr);

  StandardOpcodeLengths.reserve(OpcodeBase - 1);
  for (uint32_t I = 1; I < OpcodeBase; ++I) {
    uint8_t OpLen = DebugLineData.getU8(OffsetPtr);
    StandardOpcodeLengths.push_back(OpLen);
  }

  if (getVersion() >= 5) {
    if (Error e = parseV5DirFileTables(
            DebugLineData, OffsetPtr, EndPrologueOffset, FormParams, Ctx, U,
            ContentTypes, IncludeDirectories, FileNames)) {
      return joinErrors(
          createStringError(
              errc::invalid_argument,
              "parsing line table prologue at 0x%8.8" PRIx64
              " found an invalid directory or file table description at"
              " 0x%8.8" PRIx64,
              PrologueOffset, *OffsetPtr),
          std::move(e));
    }
  } else
    parseV2DirFileTables(DebugLineData, OffsetPtr, EndPrologueOffset,
                         ContentTypes, IncludeDirectories, FileNames);

  if (*OffsetPtr != EndPrologueOffset)
    return createStringError(errc::invalid_argument,
                       "parsing line table prologue at 0x%8.8" PRIx64
                       " should have ended at 0x%8.8" PRIx64
                       " but it ended at 0x%8.8" PRIx64,
                       PrologueOffset, EndPrologueOffset, *OffsetPtr);
  return Error::success();
}